

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexem.cpp
# Opt level: O0

int __thiscall Hpipe::Lexem::display_dot(Lexem *this,char *f,char *prg)

{
  int iVar1;
  StreamSep *pSVar2;
  StreamSep local_470;
  int local_424;
  StreamSep local_420;
  StreamSep local_3d8;
  int local_390;
  int local_38c;
  int i;
  int m;
  string local_340;
  allocator local_309;
  string local_308;
  string local_2e8;
  string local_2c8;
  undefined1 local_2a8 [8];
  StreamSepMaker os;
  ofstream of;
  char *prg_local;
  char *f_local;
  Lexem *this_local;
  
  std::ofstream::ofstream((undefined1 *)((long)&os.end.field_2 + 8),f,0x10);
  std::__cxx11::string::string((string *)&local_2c8);
  std::__cxx11::string::string((string *)&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"\n",&local_309);
  std::__cxx11::string::string((string *)&local_340);
  StreamSepMaker::StreamSepMaker
            ((StreamSepMaker *)local_2a8,(TS *)(os.end.field_2._M_local_buf + 8),&local_2c8,
             &local_2e8,&local_308,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  StreamSepMaker::operator<<
            ((StreamSep *)&i,(StreamSepMaker *)local_2a8,(char (*) [21])"digraph LexemMaker {");
  StreamSep::~StreamSep((StreamSep *)&i);
  local_38c = write_dot(this,(StreamSepMaker *)local_2a8,0);
  for (local_390 = 0; local_390 <= local_38c; local_390 = local_390 + 1) {
    StreamSepMaker::operator<<(&local_3d8,(StreamSepMaker *)local_2a8,(char (*) [3])0x24841b);
    pSVar2 = StreamSep::operator<<(&local_3d8,&local_390);
    StreamSep::operator<<(pSVar2,(char (*) [22])" [ shape=plaintext ];");
    StreamSep::~StreamSep(&local_3d8);
    if (local_390 != 0) {
      StreamSepMaker::operator<<(&local_420,(StreamSepMaker *)local_2a8,(char (*) [3])0x24841b);
      local_424 = local_390 + -1;
      pSVar2 = StreamSep::operator<<(&local_420,&local_424);
      pSVar2 = StreamSep::operator<<(pSVar2,(char (*) [5])0x249d20);
      pSVar2 = StreamSep::operator<<(pSVar2,&local_390);
      StreamSep::operator<<(pSVar2,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_420);
    }
  }
  StreamSepMaker::operator<<(&local_470,(StreamSepMaker *)local_2a8,(char (*) [2])0x24a292);
  StreamSep::~StreamSep(&local_470);
  std::ofstream::close();
  iVar1 = exec_dot(f,prg,true,true);
  StreamSepMaker::~StreamSepMaker((StreamSepMaker *)local_2a8);
  std::ofstream::~ofstream((void *)((long)&os.end.field_2 + 8));
  return iVar1;
}

Assistant:

int Lexem::display_dot( const char *f, const char *prg ) const {
    std::ofstream of( f );
    StreamSepMaker os( of );
    os << "digraph LexemMaker {";

    int m = write_dot( os, 0 );

    for( int i = 0; i <= m; ++i ) {
        os << "  " << i << " [ shape=plaintext ];";
        if ( i )
            os << "  " << i - 1 << " -> " << i << ";";
    }

    os << "}";
    of.close();

    return exec_dot( f, prg );
}